

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_open_w(archive *_a,wchar_t *pathname)

{
  int iVar1;
  int *piVar2;
  wchar_t *in_RSI;
  archive *in_RDI;
  wchar_t magic_test;
  wchar_t ret;
  archive_string path;
  archive_read_disk *a;
  char *in_stack_00000058;
  uint in_stack_00000060;
  uint in_stack_00000064;
  archive *in_stack_00000068;
  undefined4 in_stack_ffffffffffffffc4;
  archive *_a_00;
  archive *w;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar3;
  
  w = in_RDI;
  iVar1 = __archive_check_magic
                    (in_stack_00000068,in_stack_00000064,in_stack_00000060,in_stack_00000058);
  if (iVar1 == -0x1e) {
    wVar3 = L'\xffffffe2';
  }
  else {
    archive_clear_error(in_RDI);
    _a_00 = (archive *)0x0;
    wcslen(in_RSI);
    wVar3 = archive_string_append_from_wcs
                      ((archive_string *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(wchar_t *)w,
                       (size_t)in_RSI);
    if (wVar3 == L'\0') {
      wVar3 = _archive_read_disk_open(_a_00,(char *)CONCAT44(in_stack_ffffffffffffffc4,iVar1));
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
      }
      else {
        archive_set_error(in_RDI,-1,"Can\'t convert a path to a char string");
      }
      in_RDI->state = 0x8000;
      wVar3 = L'\xffffffe2';
    }
    archive_string_free((archive_string *)0x12141a);
  }
  return wVar3;
}

Assistant:

int
archive_read_disk_open_w(struct archive *_a, const wchar_t *pathname)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	struct archive_string path;
	int ret;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_NEW | ARCHIVE_STATE_CLOSED,
	    "archive_read_disk_open_w");
	archive_clear_error(&a->archive);

	/* Make a char string from a wchar_t string. */
	archive_string_init(&path);
	if (archive_string_append_from_wcs(&path, pathname,
	    wcslen(pathname)) != 0) {
		if (errno == ENOMEM)
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
		else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Can't convert a path to a char string");
		a->archive.state = ARCHIVE_STATE_FATAL;
		ret = ARCHIVE_FATAL;
	} else
		ret = _archive_read_disk_open(_a, path.s);

	archive_string_free(&path);
	return (ret);
}